

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::PageSegmentBase<Memory::VirtualAllocWrapper>::Initialize
          (PageSegmentBase<Memory::VirtualAllocWrapper> *this,DWORD allocFlags,
          bool excludeGuardPages)

{
  PageAllocatorBaseCommon *pPVar1;
  HANDLE pVVar2;
  char *lpAddress;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  HANDLE pVVar8;
  AllocatorType *pAVar9;
  DWORD local_2c [2];
  DWORD oldProtect;
  
  pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  if ((this->freePageCount != 0) &&
     ((this->super_SegmentBase<Memory::VirtualAllocWrapper>).segmentPageCount !=
      (ulong)(this->freePageCount + pAVar9[0x2e]))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x111,
                       "(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0)"
                       ,
                       "freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0"
                      );
    if (!bVar4) goto LAB_0066cefc;
    *puVar7 = 0;
  }
  bVar4 = SegmentBase<Memory::VirtualAllocWrapper>::Initialize
                    (&this->super_SegmentBase<Memory::VirtualAllocWrapper>,allocFlags,
                     excludeGuardPages);
  if (!bVar4) {
    return false;
  }
  if (this->freePageCount == 0) {
    return true;
  }
  pPVar1 = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).super_SegmentBaseCommon.allocator;
  pAVar9 = &pPVar1[-1].allocatorType;
  if (pPVar1 == (PageAllocatorBaseCommon *)0x0) {
    pAVar9 = (AllocatorType *)0x0;
  }
  pVVar2 = *(HANDLE *)(pAVar9 + 0x4a);
  pVVar8 = GetCurrentProcess();
  if (pVVar2 != pVVar8) {
    return true;
  }
  lpAddress = (this->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
  uVar5 = GetAvailablePageCount(this);
  BVar6 = VirtualProtect(lpAddress,(ulong)(uVar5 << 0xc),1,local_2c);
  if (BVar6 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x11c,"((0))","UNREACHED");
    if (bVar4) {
      *puVar7 = 0;
      return false;
    }
  }
  else {
    if (local_2c[0] == 4) {
      return true;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x11f,"(oldProtect == 0x04)","oldProtect == PAGE_READWRITE");
    if (bVar4) {
      *puVar7 = 0;
      return true;
    }
  }
LAB_0066cefc:
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

bool
PageSegmentBase<T>::Initialize(DWORD allocFlags, bool excludeGuardPages)
{
    Assert(freePageCount + this->GetAllocator()->secondaryAllocPageCount == this->segmentPageCount || freePageCount == 0);
    if (__super::Initialize(allocFlags, excludeGuardPages))
    {
        if (freePageCount != 0)
        {
            if (this->GetAllocator()->processHandle == GetCurrentProcess())
            {
                DWORD oldProtect;
                BOOL vpresult = VirtualProtect(this->address, this->GetAvailablePageCount() * AutoSystemInfo::PageSize, PAGE_NOACCESS, &oldProtect);
                if(vpresult == FALSE)
                {
                    Assert(UNREACHED);
                    return false;
                }
                Assert(oldProtect == PAGE_READWRITE);
            }
        }
        return true;
    }
    return false;
}